

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

char16_t * PAL_wcsncat(char16_t *strDest,char16_t *strSource,size_t count)

{
  char16_t *pcVar1;
  size_t sVar2;
  ulong uVar3;
  char16_t *pcVar4;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pcVar1 = strDest;
  if (strSource == (char16_t *)0x0 || strDest == (char16_t *)0x0) {
    strDest = (char16_t *)0x0;
  }
  else {
    do {
      pcVar4 = pcVar1;
      pcVar1 = pcVar4 + 1;
    } while (*pcVar4 != L'\0');
    sVar2 = PAL_wcslen(strSource);
    if ((sVar2 & 0xffffffff) < count) {
      count = sVar2 & 0xffffffff;
    }
    for (uVar3 = 0; (strSource[uVar3] != L'\0' && (uVar3 < count)); uVar3 = uVar3 + 1) {
      pcVar4[uVar3] = strSource[uVar3];
    }
    pcVar4[uVar3] = L'\0';
  }
  return strDest;
}

Assistant:

char16_t *
__cdecl
PAL_wcsncat( char16_t * strDest, const char16_t *strSource, size_t count )
{
    char16_t *start = strDest;
    UINT LoopCount = 0;
    UINT StrSourceLength = 0;

    PERF_ENTRY(wcsncat);
    ENTRY( "wcsncat (strDestination=%p (%S), strSource=%p (%S), count=%lu )\n",
            strDest ? strDest : W16_NULLSTRING,
            strDest ? strDest : W16_NULLSTRING,
            strSource ? strSource : W16_NULLSTRING,
            strSource ? strSource : W16_NULLSTRING, (unsigned long) count);

    if ( strDest == NULL )
    {
        ERROR("invalid strDest argument\n");
        LOGEXIT("wcsncat returning char16_t NULL\n");
        PERF_EXIT(wcsncat);
        return NULL;
    }

    if ( strSource == NULL )
    {
        ERROR("invalid strSource argument\n");
        LOGEXIT("wcsncat returning char16_t NULL\n");
        PERF_EXIT(wcsncat);
        return NULL;
    }

    /* find end of source string */
    while ( *strDest )
    {
        strDest++;
    }

    StrSourceLength = PAL_wcslen( strSource );
    if ( StrSourceLength < count )
    {
        count = StrSourceLength;
    }

    /* concatenate new string */
    while( *strSource && LoopCount < count )
    {
      *strDest++ = *strSource++;
      LoopCount++;
    }

    /* add terminating null */
    *strDest = '\0';

    LOGEXIT("wcsncat returning char16_t %p (%S)\n", start, start);
    PERF_EXIT(wcsncat);
    return start;
}